

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::compute_expert_loss<false>(data *sm,example *ec)

{
  float inv_weight;
  float label;
  vw *all;
  example *ec_local;
  data *sm_local;
  
  if (sm->net_weight + sm->net_feature_weight <= 0.0) {
    sm->net_feature_weight = 1.0;
    sm->average_pred = sm->feature_pred;
  }
  else {
    sm->average_pred = sm->net_feature_weight * sm->feature_pred + sm->average_pred;
  }
  sm->average_pred = (1.0 / (sm->net_weight + sm->net_feature_weight)) * sm->average_pred;
  (ec->pred).scalar = sm->average_pred;
  ec->partial_prediction = sm->average_pred;
  return;
}

Assistant:

void compute_expert_loss(data& sm, example& ec)
{
  vw& all = *sm.all;
  // add in the feature-based expert and normalize,
  float label = ec.l.simple.label;

  if (sm.net_weight + sm.net_feature_weight > 0.)
    sm.average_pred += sm.net_feature_weight * sm.feature_pred;
  else
  {
    sm.net_feature_weight = 1.;
    sm.average_pred = sm.feature_pred;
  }
  float inv_weight = 1.0f / (sm.net_weight + sm.net_feature_weight);
  sm.average_pred *= inv_weight;
  ec.pred.scalar = sm.average_pred;
  ec.partial_prediction = sm.average_pred;

  if (is_learn)
  {
    sm.alg_loss += sm.net_feature_weight * all.loss->getLoss(all.sd, sm.feature_pred, label);
    sm.alg_loss *= inv_weight;
  }
}